

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int64_t HistoQueuePush(HistoQueue *histo_queue,VP8LHistogram **histograms,int idx1,int idx2,
                      int64_t threshold)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long *in_RDI;
  int tmp;
  HistogramPair pair;
  VP8LHistogram *h2;
  VP8LHistogram *h1;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  VP8LHistogram *in_stack_ffffffffffffff90;
  VP8LHistogram *in_stack_ffffffffffffff98;
  HistogramPair *in_stack_ffffffffffffffb8;
  HistoQueue *in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  VP8LHistogram *local_8;
  
  if ((int)in_RDI[1] == *(int *)((long)in_RDI + 0xc)) {
    local_8 = (VP8LHistogram *)0x0;
  }
  else {
    local_20 = in_ECX;
    local_1c = in_EDX;
    if (in_ECX < in_EDX) {
      in_stack_ffffffffffffff84 = in_ECX;
      local_20 = in_EDX;
      local_1c = in_ECX;
    }
    iVar2 = HistoQueueUpdatePair
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       CONCAT44(local_20,local_1c),
                       (HistogramPair *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (iVar2 == 0) {
      local_8 = (VP8LHistogram *)0x0;
    }
    else {
      lVar1 = in_RDI[1];
      *(int *)(in_RDI + 1) = (int)lVar1 + 1;
      memcpy((void *)(*in_RDI + (long)(int)lVar1 * 0x40),&stack0xffffffffffffff88,0x40);
      HistoQueueUpdateHead(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_8 = in_stack_ffffffffffffff90;
    }
  }
  return (int64_t)local_8;
}

Assistant:

static int64_t HistoQueuePush(HistoQueue* const histo_queue,
                              VP8LHistogram** const histograms, int idx1,
                              int idx2, int64_t threshold) {
  const VP8LHistogram* h1;
  const VP8LHistogram* h2;
  HistogramPair pair;

  // Stop here if the queue is full.
  if (histo_queue->size == histo_queue->max_size) return 0;
  assert(threshold <= 0);
  if (idx1 > idx2) {
    const int tmp = idx2;
    idx2 = idx1;
    idx1 = tmp;
  }
  pair.idx1 = idx1;
  pair.idx2 = idx2;
  h1 = histograms[idx1];
  h2 = histograms[idx2];

  // Do not even consider the pair if it does not improve the entropy.
  if (!HistoQueueUpdatePair(h1, h2, threshold, &pair)) return 0;

  histo_queue->queue[histo_queue->size++] = pair;
  HistoQueueUpdateHead(histo_queue, &histo_queue->queue[histo_queue->size - 1]);

  return pair.cost_diff;
}